

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcborvalue_p.h
# Opt level: O0

int __thiscall
QCborContainerPrivate::stringCompareElement<QStringView>
          (QCborContainerPrivate *this,Element *e,QStringView s,Comparison mode)

{
  QStringView other;
  QStringView s_00;
  Element e_00;
  bool bVar1;
  uint uVar2;
  ByteData *this_00;
  undefined8 *in_RSI;
  QStringView *in_RDI;
  int in_R8D;
  long in_FS_OFFSET;
  ByteData *b;
  undefined4 in_stack_ffffffffffffff58;
  ValueFlag in_stack_ffffffffffffff5c;
  QStringView *pQVar3;
  undefined4 in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff8c;
  anon_union_8_2_4ee71171_for_Element_0 in_stack_ffffffffffffffa0;
  undefined8 in_stack_ffffffffffffffa8;
  QFlagsStorageHelper<QtCbor::Element::ValueFlag,_4> local_2c;
  undefined8 local_28;
  undefined8 local_20;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if (*(int *)(in_RSI + 1) == 0x60) {
    local_28 = *in_RSI;
    local_20 = in_RSI[1];
    e_00._8_8_ = in_stack_ffffffffffffffa8;
    e_00.field_0.value = in_stack_ffffffffffffffa0.value;
    pQVar3 = in_RDI;
    this_00 = byteData((QCborContainerPrivate *)
                       CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),e_00);
    if (this_00 == (ByteData *)0x0) {
      bVar1 = QStringView::isEmpty((QStringView *)0x1b2644);
      uVar2 = 0xffffffff;
      if (bVar1) {
        uVar2 = 0;
      }
    }
    else {
      local_2c.super_QFlagsStorage<QtCbor::Element::ValueFlag>.i =
           (QFlagsStorage<QtCbor::Element::ValueFlag>)
           QFlags<QtCbor::Element::ValueFlag>::operator&
                     ((QFlags<QtCbor::Element::ValueFlag> *)in_RDI,in_stack_ffffffffffffff5c);
      bVar1 = ::QFlags::operator_cast_to_bool((QFlags *)&local_2c);
      if (bVar1) {
        if (in_R8D == 0) {
          QtCbor::ByteData::asStringView(this_00);
          bVar1 = ::operator==(in_RDI,(QStringView *)
                                      CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58))
          ;
          uVar2 = (uint)!bVar1;
        }
        else {
          QtCbor::ByteData::asStringView(this_00);
          other.m_size._0_4_ = in_stack_ffffffffffffff88;
          other.m_data = (storage_type_conflict *)pQVar3;
          other.m_size._4_4_ = in_stack_ffffffffffffff8c;
          uVar2 = QStringView::compare
                            ((QStringView *)
                             CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),other,
                             CaseInsensitive);
        }
      }
      else {
        s_00.m_size._0_4_ = in_stack_ffffffffffffff88;
        s_00.m_data = (storage_type_conflict *)pQVar3;
        s_00.m_size._4_4_ = in_stack_ffffffffffffff8c;
        uVar2 = compareUtf8((ByteData *)
                            CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),s_00);
      }
    }
  }
  else {
    uVar2 = *(int *)(in_RSI + 1) - 0x60;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return uVar2;
  }
  __stack_chk_fail();
}

Assistant:

int stringCompareElement(const QtCbor::Element &e, String s, QtCbor::Comparison mode) const
    {
        if (e.type != QCborValue::String)
            return int(e.type) - int(QCborValue::String);

        const QtCbor::ByteData *b = byteData(e);
        if (!b)
            return s.isEmpty() ? 0 : -1;

        if (e.flags & QtCbor::Element::StringIsUtf16) {
            if (mode == QtCbor::Comparison::ForEquality)
                return b->asStringView() == s ? 0 : 1;
            return b->asStringView().compare(s);
        }
        return compareUtf8(b, s);
    }